

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
::emplace_new_key<slang::ConstantValue&,slang::SourceRange_const&>
          (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,ConstantValue *key,
          SourceRange *args)

{
  long lVar1;
  long lVar2;
  SourceLocation SVar3;
  long lVar4;
  char __tmp;
  ulong uVar5;
  undefined7 in_register_00000031;
  size_t sVar6;
  char __tmp_1;
  sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
  sVar7;
  EntryPointer psVar8;
  char cVar9;
  EntryPointer psVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
  pVar13;
  value_type to_insert;
  pair<slang::ConstantValue,_slang::SourceRange> local_68;
  
  lVar2 = *(long *)(this + 0x10);
  if (lVar2 != 0) {
    uVar5 = CONCAT71(in_register_00000031,distance_from_desired) & 0xffffffff;
    sVar7 = SUB81(uVar5,0);
    if (this[0x19] != sVar7) {
      lVar4 = *(long *)(this + 0x20) + 1;
      auVar11._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar11._0_8_ = lVar4;
      auVar11._12_4_ = 0x45300000;
      lVar1 = lVar2 + 1;
      auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar12._0_8_ = lVar1;
      auVar12._12_4_ = 0x45300000;
      if ((auVar11._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0) <=
          (double)*(float *)(this + 0x1c) *
          ((auVar12._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
        if (current_entry->distance_from_desired < '\0') {
          std::__detail::__variant::
          _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&(current_entry->field_1).value,
                            (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)key);
          SVar3 = args->endLoc;
          (current_entry->field_1).value.second.startLoc = args->startLoc;
          (current_entry->field_1).value.second.endLoc = SVar3;
          current_entry->distance_from_desired = (int8_t)sVar7;
          *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
          uVar5 = CONCAT71((int7)(uVar5 >> 8),1);
        }
        else {
          std::__detail::__variant::
          _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_68,
                            (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)key);
          local_68.second.startLoc = args->startLoc;
          local_68.second.endLoc = args->endLoc;
          cVar9 = current_entry->distance_from_desired;
          current_entry->distance_from_desired = (int8_t)sVar7;
          std::pair<slang::ConstantValue,_slang::SourceRange>::swap
                    (&local_68,&(current_entry->field_1).value);
          sVar7 = (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
                   )(cVar9 + '\x01');
          psVar8 = current_entry + 1;
          cVar9 = current_entry[1].distance_from_desired;
          psVar10 = current_entry;
          if (-1 < cVar9) {
            do {
              psVar10 = psVar8;
              if (cVar9 < (char)sVar7) {
                psVar10->distance_from_desired = (int8_t)sVar7;
                std::pair<slang::ConstantValue,_slang::SourceRange>::swap
                          (&local_68,&(psVar10->field_1).value);
                sVar7 = (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
                         )(cVar9 + '\x01');
              }
              else {
                sVar7 = (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
                         )((char)sVar7 + '\x01');
                if (sVar7 == this[0x19]) {
                  std::pair<slang::ConstantValue,_slang::SourceRange>::swap
                            (&local_68,&(current_entry->field_1).value);
                  uVar5 = *(long *)(this + 0x10) * 2 + 2;
                  sVar6 = 4;
                  if (4 < uVar5) {
                    sVar6 = uVar5;
                  }
                  sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
                  ::rehash((sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
                            *)this,sVar6);
                  pVar13 = emplace<std::pair<slang::ConstantValue,slang::SourceRange>>
                                     (this,&local_68);
                  current_entry = (EntryPointer)pVar13.first.current;
                  uVar5 = (ulong)pVar13._8_4_;
                  goto LAB_00398236;
                }
              }
              cVar9 = psVar10[1].distance_from_desired;
              psVar8 = psVar10 + 1;
            } while (-1 < cVar9);
          }
          std::__detail::__variant::
          _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&psVar10[1].field_1.value,
                            (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_68);
          psVar10[1].field_1.value.second.startLoc = local_68.second.startLoc;
          psVar10[1].field_1.value.second.endLoc = local_68.second.endLoc;
          psVar8->distance_from_desired = (int8_t)sVar7;
          *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
          uVar5 = CONCAT71((int7)((ulong)&local_68.second >> 8),1);
LAB_00398236:
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_68);
        }
        goto LAB_003980fe;
      }
    }
  }
  uVar5 = lVar2 * 2 + 2;
  sVar6 = 4;
  if (4 < uVar5) {
    sVar6 = uVar5;
  }
  sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
  ::rehash((sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
            *)this,sVar6);
  pVar13 = emplace<slang::ConstantValue&,slang::SourceRange_const&>(this,key,args);
  current_entry = (EntryPointer)pVar13.first.current;
  uVar5 = (ulong)pVar13._8_4_;
LAB_003980fe:
  pVar13._8_8_ = uVar5 & 0xffffffff;
  pVar13.first.current = current_entry;
  return pVar13;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }